

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPermit::~IfcPermit(IfcPermit *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x10);
  IfcObject::~IfcObject((IfcObject *)this,vtt + 2);
  return;
}

Assistant:

IfcPermit() : Object("IfcPermit") {}